

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
duckdb::DatePart::
PropagateDatePartStatistics<duckdb::date_t,duckdb::DatePart::YearWeekOperator,long>
          (vector<duckdb::BaseStatistics,_true> *child_stats,LogicalType *stats_type)

{
  bool bVar1;
  ulong uVar2;
  LogicalType *in_RDX;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> in_RDI;
  BaseStatistics result;
  long max_part;
  long min_part;
  date_t max;
  date_t min;
  value_type *nstats;
  nullptr_t in_stack_fffffffffffffe88;
  vector<duckdb::BaseStatistics,_true> *in_stack_fffffffffffffe90;
  Value local_150 [40];
  BaseStatistics *in_stack_fffffffffffffed8;
  Value local_110 [80];
  LogicalType local_c0 [24];
  BaseStatistics local_a8 [92];
  int32_t local_4c;
  long local_48;
  int32_t local_3c;
  long local_38;
  int32_t local_30;
  int32_t local_2c;
  date_t local_28;
  date_t local_24;
  reference local_20;
  LogicalType *local_18;
  
  local_18 = in_RDX;
  local_20 = vector<duckdb::BaseStatistics,_true>::operator[]
                       (in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
  uVar2 = duckdb::NumericStats::HasMinMax(local_20);
  if ((uVar2 & 1) == 0) {
    unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
    unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
              ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  else {
    local_24 = NumericStats::GetMin<duckdb::date_t>(in_stack_fffffffffffffed8);
    local_28 = NumericStats::GetMax<duckdb::date_t>(in_stack_fffffffffffffed8);
    bVar1 = date_t::operator>(&local_24,&local_28);
    if (bVar1) {
      unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
      unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
                ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    else {
      local_2c = local_24.days;
      bVar1 = duckdb::Value::IsFinite<duckdb::date_t>(local_24);
      if (bVar1) {
        local_30 = local_28.days;
        bVar1 = duckdb::Value::IsFinite<duckdb::date_t>(local_28);
        if (bVar1) {
          local_3c = local_24.days;
          local_38 = YearWeekOperator::Operation<duckdb::date_t,long>
                               ((date_t)(int32_t)((ulong)in_stack_fffffffffffffe90 >> 0x20));
          local_4c = local_28.days;
          local_48 = YearWeekOperator::Operation<duckdb::date_t,long>
                               ((date_t)(int32_t)((ulong)in_stack_fffffffffffffe90 >> 0x20));
          duckdb::LogicalType::LogicalType(local_c0,local_18);
          duckdb::NumericStats::CreateEmpty(local_a8,local_c0);
          duckdb::LogicalType::~LogicalType(local_c0);
          duckdb::Value::Value(local_110,local_38);
          duckdb::NumericStats::SetMin(local_a8,local_110);
          duckdb::Value::~Value(local_110);
          duckdb::Value::Value(local_150,local_48);
          duckdb::NumericStats::SetMax(local_a8,local_150);
          duckdb::Value::~Value(local_150);
          vector<duckdb::BaseStatistics,_true>::operator[]
                    (in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
          duckdb::BaseStatistics::CopyValidity(local_a8);
          duckdb::BaseStatistics::ToUnique();
          duckdb::BaseStatistics::~BaseStatistics(local_a8);
          return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
                 (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                  )in_RDI._M_t.
                   super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                   .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
        }
      }
      unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
      unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
                ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
  }
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
         in_RDI._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDatePartStatistics(vector<BaseStatistics> &child_stats,
	                                                              const LogicalType &stats_type = LogicalType::BIGINT) {
		// we can only propagate complex date part stats if the child has stats
		auto &nstats = child_stats[0];
		if (!NumericStats::HasMinMax(nstats)) {
			return nullptr;
		}
		// run the operator on both the min and the max, this gives us the [min, max] bound
		auto min = NumericStats::GetMin<T>(nstats);
		auto max = NumericStats::GetMax<T>(nstats);
		if (min > max) {
			return nullptr;
		}
		// Infinities prevent us from computing generic ranges
		if (!Value::IsFinite(min) || !Value::IsFinite(max)) {
			return nullptr;
		}
		TR min_part = OP::template Operation<T, TR>(min);
		TR max_part = OP::template Operation<T, TR>(max);
		auto result = NumericStats::CreateEmpty(stats_type);
		NumericStats::SetMin(result, Value(min_part));
		NumericStats::SetMax(result, Value(max_part));
		result.CopyValidity(child_stats[0]);
		return result.ToUnique();
	}